

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# returning_binder.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::ReturningBinder::BindExpression
          (BindResult *__return_storage_ptr__,ReturningBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr_ptr,idx_t depth,bool root_expression)

{
  ExpressionClass EVar1;
  type expr;
  allocator local_59;
  BinderException local_58;
  string local_48;
  
  expr = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
         operator*(expr_ptr);
  EVar1 = (expr->super_BaseExpression).expression_class;
  if (EVar1 == COLUMN_REF) {
LAB_016359d6:
    ExpressionBinder::BindExpression
              (__return_storage_ptr__,&this->super_ExpressionBinder,expr_ptr,depth,false);
  }
  else {
    if (EVar1 == BOUND_SUBQUERY) {
      ::std::__cxx11::string::string
                ((string *)&local_48,"BOUND SUBQUERY is not supported in returning statements",
                 &local_59);
      BinderException::Unsupported(&local_58,expr,&local_48);
      BindResult::BindResult(__return_storage_ptr__,&local_58.super_Exception);
    }
    else {
      if (EVar1 != SUBQUERY) goto LAB_016359d6;
      ::std::__cxx11::string::string
                ((string *)&local_48,"SUBQUERY is not supported in returning statements",&local_59);
      BinderException::Unsupported(&local_58,expr,&local_48);
      BindResult::BindResult(__return_storage_ptr__,&local_58.super_Exception);
    }
    ::std::runtime_error::~runtime_error((runtime_error *)&local_58);
    ::std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult ReturningBinder::BindExpression(unique_ptr<ParsedExpression> &expr_ptr, idx_t depth, bool root_expression) {
	auto &expr = *expr_ptr;
	switch (expr.GetExpressionClass()) {
	case ExpressionClass::SUBQUERY:
		return BindResult(BinderException::Unsupported(expr, "SUBQUERY is not supported in returning statements"));
	case ExpressionClass::BOUND_SUBQUERY:
		return BindResult(
		    BinderException::Unsupported(expr, "BOUND SUBQUERY is not supported in returning statements"));
	case ExpressionClass::COLUMN_REF:
		return ExpressionBinder::BindExpression(expr_ptr, depth);
	default:
		return ExpressionBinder::BindExpression(expr_ptr, depth);
	}
}